

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attached_database.cpp
# Opt level: O3

void __thiscall duckdb::AttachOptions::AttachOptions(AttachOptions *this,DBConfigOptions *options)

{
  pointer pcVar1;
  
  this->access_mode = options->access_mode;
  (this->db_type)._M_dataplus._M_p = (pointer)&(this->db_type).field_2;
  pcVar1 = (options->database_type)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->db_type,pcVar1,pcVar1 + (options->database_type)._M_string_length);
  (this->options)._M_h._M_buckets = &(this->options)._M_h._M_single_bucket;
  (this->options)._M_h._M_bucket_count = 1;
  (this->options)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->options)._M_h._M_element_count = 0;
  (this->options)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->options)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->options)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->default_table).catalog._M_dataplus._M_p = (pointer)&(this->default_table).catalog.field_2;
  (this->default_table).catalog._M_string_length = 0;
  (this->default_table).catalog.field_2._M_local_buf[0] = '\0';
  (this->default_table).schema._M_dataplus._M_p = (pointer)&(this->default_table).schema.field_2;
  (this->default_table).schema._M_string_length = 0;
  (this->default_table).schema.field_2._M_local_buf[0] = '\0';
  (this->default_table).name._M_dataplus._M_p = (pointer)&(this->default_table).name.field_2;
  (this->default_table).name._M_string_length = 0;
  (this->default_table).name.field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

AttachOptions::AttachOptions(const DBConfigOptions &options)
    : access_mode(options.access_mode), db_type(options.database_type) {
}